

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_heap.cpp
# Opt level: O1

BiHeap binomial_heap_union(BiHeap *h1,BiHeap *h2)

{
  int iVar1;
  _BinomialNode **pp_Var2;
  BinomialNode *pBVar3;
  BinomialNode *pBVar4;
  BinomialNode *pBVar5;
  _BinomialNode *p_Var6;
  _BinomialNode *p_Var7;
  _BinomialNode **pp_Var8;
  int iVar9;
  _BinomialNode **pp_Var10;
  BinomialNode *pBVar11;
  
  pp_Var2 = (_BinomialNode **)operator_new(8);
  *pp_Var2 = (_BinomialNode *)0x0;
  pBVar3 = binomial_heap_merge(*h1,*h2);
  *pp_Var2 = pBVar3;
  free(*h1);
  *h1 = (BiHeap)0x0;
  free(*h2);
  *h2 = (BiHeap)0x0;
  if ((pBVar3 != (BinomialNode *)0x0) && (p_Var6 = pBVar3->sibling, p_Var6 != (_BinomialNode *)0x0))
  {
    pBVar4 = (BinomialNode *)0x0;
    do {
      pp_Var8 = &pBVar3->sibling;
      iVar9 = pBVar3->degree;
      iVar1 = p_Var6->degree;
      pBVar5 = pBVar3;
      pBVar11 = p_Var6;
      if ((iVar9 == iVar1) &&
         ((p_Var7 = p_Var6->sibling, p_Var7 == (_BinomialNode *)0x0 || (iVar9 != p_Var7->degree))))
      {
        if (p_Var6->key < pBVar3->key) {
          pp_Var10 = &pBVar4->sibling;
          if (pBVar4 == (BinomialNode *)0x0) {
            pp_Var10 = pp_Var2;
          }
          *pp_Var10 = p_Var6;
          p_Var7 = p_Var6;
          p_Var6 = pBVar3;
          iVar9 = iVar1;
        }
        else {
          *pp_Var8 = p_Var7;
          pp_Var8 = &p_Var6->sibling;
          p_Var7 = pBVar3;
        }
        p_Var6->p = p_Var7;
        *pp_Var8 = p_Var7->child;
        p_Var7->child = p_Var6;
        p_Var7->degree = iVar9 + 1;
        pBVar5 = pBVar4;
        pBVar11 = pBVar3;
      }
      p_Var6 = pBVar11->sibling;
      pBVar4 = pBVar5;
      pBVar3 = pBVar11;
    } while (p_Var6 != (_BinomialNode *)0x0);
  }
  return (BiHeap)pp_Var2;
}

Assistant:

BiHeap binomial_heap_union(BiHeap *h1, BiHeap *h2) {
    BiHeap h = binomial_heap_make();
//    firstly merge two heaps
    h->head = binomial_heap_merge(*h1, *h2);
    free(*h1);
    *h1 = NULL;
    free(*h2);
    *h2 = NULL;
//    if the result is empty, ignore next steps
    if (h->head == NULL) {
        return h;
    }

    BinomialNode *prev = NULL;
    BinomialNode *x = h->head;
    BinomialNode *next = x->sibling;

//  travelling the root list, and merge the adjacent heaps which have same degree.
    while (next != NULL) {
        if (x->degree != next->degree
            || (next->sibling != NULL
                && x->degree == next->sibling->degree)) {
            // case 3 or case 2, just move forward
            prev = x;
            x = next;
        } else if (x->key <= next->key) {
            // x->key <= next->key
            x->sibling = next->sibling;
            binomial_link(next, x);
        } else {
            // x->key > next->key
            if (prev == NULL) {
                h->head = next;
            } else {
                prev->sibling = next;
            }
            binomial_link(x, next);
        }
        // change the next
        next = x->sibling;
    }
    return h;
}